

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::ReportLastSystemError(char *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string m;
  char *msg_local;
  
  m.field_2._8_8_ = msg;
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  cmStrCat<char_const*&,char_const(&)[17],std::__cxx11::string>
            ((string *)local_30,(char **)((long)&m.field_2 + 8),(char (*) [17])": System Error: ",
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Error((string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmSystemTools::ReportLastSystemError(const char* msg)
{
  std::string m =
    cmStrCat(msg, ": System Error: ", Superclass::GetLastSystemError());
  cmSystemTools::Error(m);
}